

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head,LinkInterfaceFor implFor)

{
  string_view arg;
  bool bVar1;
  __type _Var2;
  PolicyStatus PVar3;
  cmTargetLinkLibraryType cVar4;
  reference __rhs;
  pointer pcVar5;
  cmTarget *this_00;
  ostream *poVar6;
  cmSourceFile *this_01;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  cmake *pcVar7;
  LinkLibraryVectorType *this_03;
  string *psVar8;
  ulong uVar9;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool local_691;
  cmListFileBacktrace local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_5b8;
  cmLinkItem local_588;
  undefined1 local_548 [8];
  string name_1;
  LibraryID *oldllib;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  LinkLibraryVectorType *__range1_1;
  LinkLibraryVectorType *oldllibs;
  undefined1 local_4f8 [4];
  cmTargetLinkLibraryType linkType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  cmValue local_4d0;
  reference local_4c8;
  string *sp;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *seenProps;
  string local_498;
  cmSourceFile *local_478;
  cmSourceFile *sf;
  string *maybeObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_438;
  undefined1 local_408 [8];
  cmLinkItem item;
  undefined1 local_3c0 [16];
  string local_3b0;
  string local_390;
  undefined1 local_370 [8];
  ostringstream e;
  MessageType local_1f8;
  MessageType messageType;
  bool noMessage;
  cmTarget *target;
  string name;
  string *lib;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool local_191;
  _Base_ptr p_Stack_190;
  bool checkCMP0027;
  string *evaluated;
  undefined1 local_168 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_150 [8];
  cmGeneratorExpression ge;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin1;
  cmBTStringRange *__range1;
  cmBTStringRange entryRange;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  cmGeneratorTarget *pcStack_28;
  LinkInterfaceFor implFor_local;
  cmGeneratorTarget *head_local;
  cmOptionalLinkImplementation *impl_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  mf = (cmMakefile *)this->LocalGenerator;
  lg._4_4_ = implFor;
  pcStack_28 = head;
  head_local = (cmGeneratorTarget *)impl;
  impl_local = (cmOptionalLinkImplementation *)config;
  config_local = (string *)this;
  entryRange.End._M_current =
       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       cmLocalGenerator::GetMakefile((cmLocalGenerator *)mf);
  ___range1 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::begin((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&__range1);
  entry = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::end((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&__range1);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&entry);
    if (!bVar1) {
      if (pcStack_28 == this) {
        anon_unknown.dwarf_1247fe5::ComputeLinkImplTransitive
                  (this,(string *)impl_local,lg._4_4_,(cmLinkImplementation *)head_local);
      }
      pcVar7 = cmMakefile::GetCMakeInstance(this->Makefile);
      cmake::GetDebugConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4f8,pcVar7);
      cVar4 = CMP0003_ComputeLinkType
                        ((string *)impl_local,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_4f8);
      this_03 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this->Target);
      __end1_1 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                 ::begin(this_03);
      oldllib = (LibraryID *)
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                ::end(this_03);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                                 *)&oldllib), bVar1) {
        name_1.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
             ::operator*(&__end1_1);
        if ((((reference)name_1.field_2._8_8_)->second != GENERAL_LibraryType) &&
           (((reference)name_1.field_2._8_8_)->second != cVar4)) {
          CheckCMP0004((string *)local_548,this,(string *)name_1.field_2._8_8_);
          psVar8 = GetName_abi_cxx11_(this);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_548,psVar8);
          if ((_Var2) || (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
            item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_ = 0xb;
          }
          else {
            psVar8 = &head_local->ObjectDirectory;
            std::__cxx11::string::string((string *)&local_5d8,(string *)local_548);
            local_5e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_5e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            cmListFileBacktrace::cmListFileBacktrace(&local_5e8);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                      (&local_5b8,&local_5d8,&local_5e8);
            ResolveLinkItem(&local_588,this,&local_5b8);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&psVar8->field_2,
                       &local_588);
            cmLinkItem::~cmLinkItem(&local_588);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT(&local_5b8);
            cmListFileBacktrace::~cmListFileBacktrace(&local_5e8);
            std::__cxx11::string::~string((string *)&local_5d8);
            item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_ = 0;
          }
          std::__cxx11::string::~string((string *)local_548);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
        ::operator++(&__end1_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4f8);
      return;
    }
    __rhs = __gnu_cxx::
            __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dagChecker.CheckResult);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"LINK_LIBRARIES",&local_129);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_108,this,&local_128,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    if (((lg._4_4_ == Usage) && (PVar3 = GetPolicyStatusCMP0131(this), WARN < PVar3)) &&
       (PVar3 - NEW < 3)) {
      cmGeneratorExpressionDAGChecker::SetTransitivePropertiesOnly
                ((cmGeneratorExpressionDAGChecker *)local_108);
    }
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge,&__rhs->Backtrace);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_150,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    std::__cxx11::string::string((string *)&evaluated,(string *)__rhs);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_168,(string *)local_150);
    std::__cxx11::string::~string((string *)&evaluated);
    pcVar5 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_168);
    cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(pcVar5,true);
    pcVar5 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_168);
    p_Stack_190 = (_Base_ptr)
                  cmCompiledGeneratorExpression::Evaluate
                            (pcVar5,this->LocalGenerator,(string *)impl_local,pcStack_28,
                             (cmGeneratorExpressionDAGChecker *)local_108,(cmGeneratorTarget *)0x0,
                             &this->LinkerLanguage);
    local_191 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Stack_190,&__rhs->Value);
    arg = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)p_Stack_190);
    cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dagChecker.CheckResult,false);
    pcVar5 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_168);
    bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar5);
    if (bVar1) {
      *(byte *)((long)&(head_local->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_color + 3) = 1;
    }
    pcVar5 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_168);
    bVar1 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar5);
    if (bVar1) {
      *(undefined1 *)
       &(head_local->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _S_black;
    }
    pcVar5 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_168);
    bVar1 = cmCompiledGeneratorExpression::GetHadLinkLanguageSensitiveCondition(pcVar5);
    if (bVar1) {
      *(undefined1 *)
       &(head_local->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black
      ;
    }
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dagChecker.CheckResult);
    lib = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dagChecker.CheckResult);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&lib), bVar1) {
      name.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      bVar1 = IsLinkLookupScope(this,(string *)name.field_2._8_8_,(cmLocalGenerator **)&mf);
      if (!bVar1) {
        CheckCMP0004((string *)&target,this,(string *)name.field_2._8_8_);
        PVar3 = GetPolicyStatusCMP0108(this);
        if ((PVar3 == NEW) &&
           (this_00 = cmMakefile::FindTargetToUse(this->Makefile,(string *)&target,false),
           this_00 != (cmTarget *)0x0)) {
          psVar8 = cmTarget::GetName_abi_cxx11_(this_00);
          std::__cxx11::string::operator=((string *)&target,(string *)psVar8);
        }
        psVar8 = GetName_abi_cxx11_(this);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&target,psVar8);
        if ((_Var2) || (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
          psVar8 = GetName_abi_cxx11_(this);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&target,psVar8);
          if (_Var2) {
            bVar1 = false;
            local_1f8 = FATAL_ERROR;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
            PVar3 = GetPolicyStatusCMP0038(this);
            if (PVar3 == OLD) {
              bVar1 = true;
            }
            else if (PVar3 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_390,(cmPolicies *)0x26,id);
              poVar6 = std::operator<<((ostream *)local_370,(string *)&local_390);
              std::operator<<(poVar6,"\n");
              std::__cxx11::string::~string((string *)&local_390);
              local_1f8 = AUTHOR_WARNING;
            }
            if (bVar1) {
LAB_00832c80:
              item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._4_4_ = 0;
            }
            else {
              poVar6 = std::operator<<((ostream *)local_370,"Target \"");
              psVar8 = GetName_abi_cxx11_(this);
              poVar6 = std::operator<<(poVar6,(string *)psVar8);
              std::operator<<(poVar6,"\" links to itself.");
              pcVar7 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
              std::__cxx11::ostringstream::str();
              GetBacktrace((cmGeneratorTarget *)local_3c0);
              cmake::IssueMessage(pcVar7,local_1f8,(string *)(local_3c0 + 0x10),
                                  (cmListFileBacktrace *)local_3c0);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_3c0);
              std::__cxx11::string::~string((string *)(local_3c0 + 0x10));
              if (local_1f8 != FATAL_ERROR) goto LAB_00832c80;
              item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._4_4_ = 1;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
            if (item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._4_4_ == 0) goto LAB_00832cb9;
          }
          else {
LAB_00832cb9:
            item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_ = 6;
          }
        }
        else {
          std::__cxx11::string::string((string *)&local_458,(string *)&target);
          cmListFileBacktrace::cmListFileBacktrace
                    ((cmListFileBacktrace *)&maybeObj,&__rhs->Backtrace);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_438,&local_458,(cmListFileBacktrace *)&maybeObj);
          ResolveLinkItem((cmLinkItem *)local_408,this,&local_438,(cmLocalGenerator *)mf);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_438);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&maybeObj);
          std::__cxx11::string::~string((string *)&local_458);
          if (item.String.field_2._8_8_ == 0) {
            sf = (cmSourceFile *)cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)local_408);
            bVar1 = cmsys::SystemTools::FileIsFullPath((string *)sf);
            if (!bVar1) goto LAB_00832f9f;
            this_01 = cmMakefile::GetSource
                                ((cmMakefile *)entryRange.End._M_current,(string *)sf,Known);
            seenProps._6_1_ = 0;
            seenProps._5_1_ = 0;
            local_691 = false;
            local_478 = this_01;
            if (this_01 != (cmSourceFile *)0x0) {
              std::allocator<char>::allocator();
              seenProps._6_1_ = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_498,"EXTERNAL_OBJECT",
                         (allocator<char> *)((long)&seenProps + 7));
              seenProps._5_1_ = 1;
              local_691 = cmSourceFile::GetPropertyAsBool(this_01,&local_498);
            }
            if ((seenProps._5_1_ & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_498);
            }
            if ((seenProps._6_1_ & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)((long)&seenProps + 7));
            }
            if (local_691 == false) goto LAB_00832f9f;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                       &head_local->GlobalGenerator,(cmLinkItem *)local_408);
            item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_ = 6;
          }
          else {
LAB_00832f9f:
            std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>::
            emplace_back<cmLinkItem,bool_const&>
                      ((vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *)head_local,
                       (cmLinkItem *)local_408,&local_191);
            item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_ = 0;
          }
          cmLinkItem::~cmLinkItem((cmLinkItem *)local_408);
        }
        std::__cxx11::string::~string((string *)&target);
        if ((item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._4_4_ != 0) &&
           (item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._4_4_ != 6)) goto LAB_0083317f;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    pcVar5 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_168);
    this_02 = cmCompiledGeneratorExpression::GetSeenTargetProperties_abi_cxx11_(pcVar5);
    __end2_1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_02);
    sp = (string *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_02);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&sp), bVar1) {
      local_4c8 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2_1);
      local_4d0 = GetProperty(this,local_4c8);
      bVar1 = cmValue::operator_cast_to_bool(&local_4d0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(&this->LinkImplicitNullProperties,local_4c8);
        debugConfigs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar10.first._M_node;
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_1);
    }
    pcVar5 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_168);
    cmCompiledGeneratorExpression::GetMaxLanguageStandard(pcVar5,this,&this->MaxLanguageStandards);
    item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
LAB_0083317f:
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_168);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_150);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&dagChecker.CheckResult);
    if (item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ != 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head, LinkInterfaceFor implFor) const
{
  cmLocalGenerator const* lg = this->LocalGenerator;
  cmMakefile const* mf = lg->GetMakefile();
  cmBTStringRange entryRange = this->Target->GetLinkImplementationEntries();
  // Collect libraries directly linked in this configuration.
  for (auto const& entry : entryRange) {
    std::vector<std::string> llibs;
    // Keep this logic in sync with ExpandLinkItems.
    cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_LIBRARIES", nullptr,
                                               nullptr);
    // The $<LINK_ONLY> expression may be used to specify link dependencies
    // that are otherwise excluded from usage requirements.
    if (implFor == LinkInterfaceFor::Usage) {
      switch (this->GetPolicyStatusCMP0131()) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          dagChecker.SetTransitivePropertiesOnly();
          break;
      }
    }
    cmGeneratorExpression ge(entry.Backtrace);
    std::unique_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(entry.Value);
    cge->SetEvaluateForBuildsystem(true);
    std::string const& evaluated =
      cge->Evaluate(this->LocalGenerator, config, head, &dagChecker, nullptr,
                    this->LinkerLanguage);
    bool const checkCMP0027 = evaluated != entry.Value;
    cmExpandList(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }
    if (cge->GetHadContextSensitiveCondition()) {
      impl.HadContextSensitiveCondition = true;
    }
    if (cge->GetHadLinkLanguageSensitiveCondition()) {
      impl.HadLinkLanguageSensitiveCondition = true;
    }

    for (std::string const& lib : llibs) {
      if (this->IsLinkLookupScope(lib, lg)) {
        continue;
      }

      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(lib);
      if (this->GetPolicyStatusCMP0108() == cmPolicies::NEW) {
        // resolve alias name
        auto* target = this->Makefile->FindTargetToUse(name);
        if (target) {
          name = target->GetName();
        }
      }
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          MessageType messageType = MessageType::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == MessageType::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      cmLinkItem item =
        this->ResolveLinkItem(BT<std::string>(name, entry.Backtrace), lg);
      if (!item.Target) {
        // Report explicitly linked object files separately.
        std::string const& maybeObj = item.AsStr();
        if (cmSystemTools::FileIsFullPath(maybeObj)) {
          cmSourceFile const* sf =
            mf->GetSource(maybeObj, cmSourceFileLocationKind::Known);
          if (sf && sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
            impl.Objects.emplace_back(std::move(item));
            continue;
          }
        }
      }

      impl.Libraries.emplace_back(std::move(item), checkCMP0027);
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::string const& sp : seenProps) {
      if (!this->GetProperty(sp)) {
        this->LinkImplicitNullProperties.insert(sp);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Update the list of direct link dependencies from usage requirements.
  if (head == this) {
    ComputeLinkImplTransitive(this, config, implFor, impl);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LibraryID const& oldllib : oldllibs) {
    if (oldllib.second != GENERAL_LibraryType && oldllib.second != linkType) {
      std::string name = this->CheckCMP0004(oldllib.first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        this->ResolveLinkItem(BT<std::string>(name)));
    }
  }
}